

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O0

IntrinsicResult intrinsic_exit(Context *context,IntrinsicResult *partialResult)

{
  bool bVar1;
  String local_40;
  Value resultCode;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  exitASAP = true;
  MiniScript::String::String(&local_40,"resultCode");
  MiniScript::Context::GetVar
            ((Context *)&stack0xffffffffffffffd0,(String *)partialResult,(LocalOnlyMode)&local_40);
  MiniScript::String::~String(&local_40);
  bVar1 = MiniScript::Value::IsNull((Value *)&stack0xffffffffffffffd0);
  if (!bVar1) {
    exitResult = MiniScript::Value::IntValue((Value *)&stack0xffffffffffffffd0);
  }
  MiniScript::Machine::Stop((Machine *)partialResult[0xe].rs);
  MiniScript::IntrinsicResult::IntrinsicResult
            ((IntrinsicResult *)context,(IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
  MiniScript::Value::~Value((Value *)&stack0xffffffffffffffd0);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_exit(Context *context, IntrinsicResult partialResult) {
	exitASAP = true;
	Value resultCode = context->GetVar("resultCode");
	if (!resultCode.IsNull()) exitResult = (int)resultCode.IntValue();
	context->vm->Stop();
	return IntrinsicResult::Null;
}